

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Areal_Object_State_PDU::operator==
          (Areal_Object_State_PDU *this,Areal_Object_State_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Object_State_Header::operator!=
                    (&this->super_Object_State_Header,&Value->super_Object_State_Header);
  if ((((!KVar1) &&
       ((this->super_Object_State_Header).field_0x4b ==
        (Value->super_Object_State_Header).field_0x4b)) &&
      (KVar1 = DATA_TYPE::ObjectType::operator!=(&this->m_ObjTyp,&Value->m_ObjTyp), !KVar1)) &&
     (((KVar1 = DATA_TYPE::ArealObjectAppearance::operator!=(&this->m_Apperance,&Value->m_Apperance)
       , !KVar1 && (this->m_ui16NumPoints == Value->m_ui16NumPoints)) &&
      ((KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID), !KVar1
       && (KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_RecvID,&Value->m_RecvID),
          !KVar1)))))) {
    bVar2 = std::operator!=(&this->m_vPoints,&Value->m_vPoints);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Areal_Object_State_PDU::operator == ( const Areal_Object_State_PDU & Value ) const
{
    if( Object_State_Header::operator          != ( Value ) )             return false;
    if( m_ModificationUnion.m_ui8Modifications != Value.m_ModificationUnion.m_ui8Modifications ) return false;
    if( m_ObjTyp                               != Value.m_ObjTyp )        return false;
    if( m_Apperance                            != Value.m_Apperance )     return false;
    if( m_ui16NumPoints                        != Value.m_ui16NumPoints ) return false;
    if( m_ReqID                                != Value.m_ReqID )         return false;
    if( m_RecvID                               != Value.m_RecvID )        return false;
    if( m_vPoints                              != Value.m_vPoints )       return false;
    return true;
}